

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::ProgramUniformCase::iterate(ProgramUniformCase *this)

{
  DataType dType;
  RenderContext *renderCtx;
  pointer ppSVar1;
  int iVar2;
  GLuint programA;
  GLuint programB;
  uint uVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  GLSLVersion glslVersion;
  allocator<char> local_27a;
  allocator<char> local_279;
  string frag;
  string vtx;
  string fragNoMain;
  string local_210;
  string local_1f0;
  ShaderProgram progNoLink;
  vector<char,_std::allocator<char>_> shaderbuf;
  undefined8 *puVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar2);
  iVar2 = 1000;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    frag._M_dataplus._M_p = frag._M_dataplus._M_p & 0xffffffff00000000;
    progNoLink.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&progNoLink.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    progNoLink.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    progNoLink.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    dType = *(DataType *)((long)&DAT_017411a0 + lVar6);
    generateUniformFragSrc(this,(string *)&progNoLink,this->m_glslVersion,dType);
    ppSVar1 = progNoLink.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    std::vector<char,_std::allocator<char>_>::vector
              (&shaderbuf,
               (long)progNoLink.m_shaders[0].
                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1,(allocator_type *)&fragNoMain);
    std::__cxx11::string::copy
              ((char *)&progNoLink,
               (ulong)shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,(ulong)ppSVar1);
    shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)ppSVar1] = '\0';
    vtx._M_dataplus._M_p =
         shaderbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    programA = (*(code *)puVar5[0x7f])(0x8b30,1,&vtx);
    programB = (*(code *)puVar5[0x7f])(0x8b30,1,&vtx);
    if (dType - TYPE_FLOAT_MAT2 < 9 || dType - TYPE_DOUBLE_MAT2 < 9) {
      setAndCompareMatrixUniforms(this,(GLuint)frag._M_dataplus._M_p,programA,programB,dType,iVar2);
      (*(code *)puVar5[0xdb])(1,&frag);
      (*(code *)puVar5[0x13])((ulong)frag._M_dataplus._M_p & 0xffffffff);
      (*(code *)puVar5[0x2d1])((ulong)frag._M_dataplus._M_p & 0xffffffff,2,programA);
      setAndCompareMatrixUniforms
                (this,(GLuint)frag._M_dataplus._M_p,programA,programB,dType,iVar2 + 100);
      (*(code *)*puVar5)((ulong)frag._M_dataplus._M_p & 0xffffffff,programB);
      setAndCompareMatrixUniforms
                (this,(GLuint)frag._M_dataplus._M_p,programA,programB,dType,iVar2 + 200);
    }
    else {
      setAndCompareUniforms(this,(GLuint)frag._M_dataplus._M_p,programA,programB,dType,iVar2);
      (*(code *)puVar5[0xdb])(1,&frag);
      (*(code *)puVar5[0x13])((ulong)frag._M_dataplus._M_p & 0xffffffff);
      (*(code *)puVar5[0x2d1])((ulong)frag._M_dataplus._M_p & 0xffffffff,2,programA);
      setAndCompareUniforms(this,(GLuint)frag._M_dataplus._M_p,programA,programB,dType,iVar2 + 100);
      (*(code *)*puVar5)((ulong)frag._M_dataplus._M_p & 0xffffffff,programB);
      setAndCompareUniforms(this,(GLuint)frag._M_dataplus._M_p,programA,programB,dType,iVar2 + 200);
    }
    (*(code *)puVar5[0x89])(programA);
    (*(code *)puVar5[0x89])(programB);
    (*(code *)puVar5[0x8a])(1,&frag);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&shaderbuf.super__Vector_base<char,_std::allocator<char>_>);
    std::__cxx11::string::~string((string *)&progNoLink);
    iVar2 = iVar2 + 1000;
  }
  vtx._M_dataplus._M_p = (pointer)&vtx.field_2;
  vtx._M_string_length = 0;
  frag._M_dataplus._M_p = (pointer)&frag.field_2;
  frag._M_string_length = 0;
  vtx.field_2._M_local_buf[0] = '\0';
  frag.field_2._M_local_buf[0] = '\0';
  generateBasicVertexSrc_abi_cxx11_
            ((string *)&progNoLink,(glcts *)(ulong)this->m_glslVersion,GLSL_VERSION_100_ES);
  std::__cxx11::string::operator=((string *)&vtx,(string *)&progNoLink);
  std::__cxx11::string::~string((string *)&progNoLink);
  generateBasicFragmentSrc_abi_cxx11_
            ((string *)&progNoLink,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::operator=((string *)&frag,(string *)&progNoLink);
  std::__cxx11::string::~string((string *)&progNoLink);
  std::__cxx11::string::string((string *)&fragNoMain,(string *)&frag);
  uVar3 = std::__cxx11::string::find((char *)&fragNoMain,0x173edb8);
  std::__cxx11::string::replace((ulong)&fragNoMain,(ulong)uVar3,&DAT_00000004);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,vtx._M_dataplus._M_p,&local_279);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,fragNoMain._M_dataplus._M_p,&local_27a);
  glu::makeVtxFragSources((ProgramSources *)&shaderbuf,&local_1f0,&local_210);
  glu::ShaderProgram::ShaderProgram(&progNoLink,renderCtx,(ProgramSources *)&shaderbuf);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&shaderbuf);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  (*(code *)puVar5[0x20b])(progNoLink.m_program.m_program,0x8258,1);
  (*(code *)puVar5[0x19d])(progNoLink.m_program.m_program);
  uVar4 = (*(code *)puVar5[0x169])(progNoLink.m_program.m_program,"u_color");
  (*(code *)puVar5[0x226])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000,progNoLink.m_program.m_program,uVar4);
  iVar2 = (*(code *)puVar5[0x100])();
  if (iVar2 == 0x502) {
    (*(code *)puVar5[0x89])(progNoLink.m_program.m_program);
    (*(code *)puVar5[0x226])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000,progNoLink.m_program.m_program);
    iVar2 = (*(code *)puVar5[0x100])();
    if (iVar2 == 0x501) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ShaderProgram::~ShaderProgram(&progNoLink);
      std::__cxx11::string::~string((string *)&fragNoMain);
      std::__cxx11::string::~string((string *)&frag);
      std::__cxx11::string::~string((string *)&vtx);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"ProgramUniformi failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x7b9);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"ProgramUniformi failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
               ,0x7b0);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate(void)
	{
		const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
		glu::DataType		  dType[5] = { glu::TYPE_INT, glu::TYPE_UINT, glu::TYPE_FLOAT, glu::TYPE_FLOAT_MAT2,
								   glu::TYPE_FLOAT_MAT2X3 };

		// Loop over the various data types, generate fragment programs, and test uniforms
		// (MAT2 means stands for all square matrices, MAT2x3 stands for all non-square matrices)
		for (int i = 0; i < 5; i++)
		{
			glw::GLuint programA, programB;
			glw::GLuint pipeline = 0;
			const char* shaderSrc[1];
			std::string fragSrc;
			int			seed = 1000 + (1000 * i);

			generateUniformFragSrc(fragSrc, m_glslVersion, dType[i]);

			size_t			  length = fragSrc.size();
			std::vector<char> shaderbuf(length + 1);
			fragSrc.copy(&shaderbuf[0], length);
			shaderbuf[length] = '\0';
			shaderSrc[0]	  = &shaderbuf[0];
			programA		  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);
			programB		  = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, shaderSrc);

			if (isDataTypeMatrix(dType[i]))
			{
				// programs are unbound
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);

				// bind one program with useProgramStages
				gl.genProgramPipelines(1, &pipeline);
				gl.bindProgramPipeline(pipeline);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programA);
				seed += 100;
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);

				// make an active program with activeShaderProgram
				gl.activeShaderProgram(pipeline, programB);
				seed += 100;
				setAndCompareMatrixUniforms(pipeline, programA, programB, dType[i], seed);
			}
			else
			{
				// programs are unbound
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);

				// bind one program with useProgramStages
				gl.genProgramPipelines(1, &pipeline);
				gl.bindProgramPipeline(pipeline);
				gl.useProgramStages(pipeline, GL_FRAGMENT_SHADER_BIT, programA);
				seed += 100;
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);

				// make an active program with activeShaderProgram
				gl.activeShaderProgram(pipeline, programB);
				seed += 100;
				setAndCompareUniforms(pipeline, programA, programB, dType[i], seed);
			}

			gl.deleteProgram(programA);
			gl.deleteProgram(programB);
			gl.deleteProgramPipelines(1, &pipeline);
		}

		// Negative Cases

		// Program that is not successfully linked
		glw::GLenum err;
		std::string vtx;
		std::string frag;

		vtx  = generateBasicVertexSrc(m_glslVersion);
		frag = generateBasicFragmentSrc(m_glslVersion);

		// remove the main keyword so it doesn't link
		std::string  fragNoMain = frag;
		unsigned int pos		= (unsigned int)fragNoMain.find("main");
		fragNoMain.replace(pos, 4, "niaM");
		glu::ShaderProgram progNoLink(m_context.getRenderContext(),
									  glu::makeVtxFragSources(vtx.c_str(), fragNoMain.c_str()));
		gl.programParameteri(progNoLink.getProgram(), GL_PROGRAM_SEPARABLE, GL_TRUE);
		gl.linkProgram(progNoLink.getProgram());
		int unifLocation = gl.getUniformLocation(progNoLink.getProgram(), "u_color");
		gl.programUniform4f(progNoLink.getProgram(), unifLocation, 1.0, 1.0, 1.0, 1.0);
		err = gl.getError();
		if (err != GL_INVALID_OPERATION)
		{
			TCU_FAIL("ProgramUniformi failed");
		}

		// deleted program
		gl.deleteProgram(progNoLink.getProgram());
		gl.programUniform4f(progNoLink.getProgram(), unifLocation, 1.0, 1.0, 1.0, 1.0);
		err = gl.getError();
		if (err != GL_INVALID_VALUE)
		{
			TCU_FAIL("ProgramUniformi failed");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}